

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall QSslSocketPrivate::flush(QSslSocketPrivate *this)

{
  QSslSocketPrivate *in_RDI;
  bool local_11;
  
  if (in_RDI->mode != UnencryptedMode) {
    transmit(in_RDI);
  }
  local_11 = false;
  if (in_RDI->plainSocket != (QTcpSocket *)0x0) {
    local_11 = QAbstractSocket::flush((QAbstractSocket *)0x3a74b0);
  }
  return local_11;
}

Assistant:

bool QSslSocketPrivate::flush()
{
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocketPrivate::flush()";
#endif
    if (mode != QSslSocket::UnencryptedMode) {
        // encrypt any unencrypted bytes in our buffer
        transmit();
    }

    return plainSocket && plainSocket->flush();
}